

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_PLTE(LodePNGColorMode *color,uchar *data,size_t chunkLength)

{
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (color->palette != (uchar *)0x0) {
    free(color->palette);
  }
  color->palettesize = chunkLength / 3;
  puVar2 = (uchar *)malloc((chunkLength / 3) * 4);
  color->palette = puVar2;
  if (chunkLength < 3 || puVar2 != (uchar *)0x0) {
    uVar1 = 0x26;
    if (chunkLength < 0x303) {
      uVar1 = 0;
      if (color->palettesize != 0) {
        uVar3 = 3;
        uVar4 = 1;
        uVar5 = 1;
        do {
          color->palette[uVar3 - 3] = data[uVar4 - 1];
          color->palette[uVar3 - 2] = data[uVar4];
          color->palette[uVar3 - 1] = data[uVar4 + 1];
          color->palette[uVar3] = 0xff;
          uVar6 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          uVar3 = uVar3 + 4;
          uVar4 = uVar4 + 3;
          uVar1 = 0;
        } while (color->palettesize != uVar6);
      }
    }
  }
  else {
    color->palettesize = 0;
    uVar1 = 0x53;
  }
  return uVar1;
}

Assistant:

static unsigned readChunk_PLTE(LodePNGColorMode* color, const unsigned char* data, size_t chunkLength)
{
	unsigned pos = 0, i;
	if (color->palette) lodepng_free(color->palette);
	color->palettesize = chunkLength / 3;
	color->palette = (unsigned char*)lodepng_malloc(4 * color->palettesize);
	if (!color->palette && color->palettesize)
	{
		color->palettesize = 0;
		return 83; /*alloc fail*/
	}
	if (color->palettesize > 256) return 38; /*error: palette too big*/

	for (i = 0; i != color->palettesize; ++i)
	{
		color->palette[4 * i + 0] = data[pos++]; /*R*/
		color->palette[4 * i + 1] = data[pos++]; /*G*/
		color->palette[4 * i + 2] = data[pos++]; /*B*/
		color->palette[4 * i + 3] = 255; /*alpha*/
	}

	return 0; /* OK */
}